

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void MergeClasses(TidyDocImpl *doc,Node *node,Node *child)

{
  uint uVar1;
  uint uVar2;
  tmbstr s1_00;
  AttVal *av_00;
  uint l2;
  uint l1;
  tmbstr names;
  tmbstr s2;
  tmbstr s1;
  AttVal *av;
  Node *child_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  names = (tmbstr)0x0;
  for (s1 = (tmbstr)child->attributes; s1 != (tmbstr)0x0; s1 = *(tmbstr *)s1) {
    if (((s1 != (tmbstr)0x0) && (*(long *)(s1 + 8) != 0)) && (**(int **)(s1 + 8) == 0x1a)) {
      names = *(tmbstr *)(s1 + 0x30);
      break;
    }
  }
  s2 = (tmbstr)0x0;
  s1 = (tmbstr)node->attributes;
  do {
    if (s1 == (tmbstr)0x0) {
LAB_00164cc2:
      if (s2 == (tmbstr)0x0) {
        if (names != (tmbstr)0x0) {
          av_00 = prvTidyNewAttributeEx(doc,"class",names,0x22);
          prvTidyInsertAttributeAtStart(node,av_00);
        }
      }
      else if (names != (tmbstr)0x0) {
        uVar1 = prvTidytmbstrlen(s2);
        uVar2 = prvTidytmbstrlen(names);
        s1_00 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,(long)uVar1 + (long)uVar2 + 2)
        ;
        prvTidytmbstrcpy(s1_00,s2);
        s1_00[uVar1] = ' ';
        prvTidytmbstrcpy(s1_00 + (ulong)uVar1 + 1,names);
        (*doc->allocator->vtbl->free)(doc->allocator,*(void **)(s1 + 0x30));
        *(tmbstr *)(s1 + 0x30) = s1_00;
      }
      return;
    }
    if (((s1 != (tmbstr)0x0) && (*(long *)(s1 + 8) != 0)) && (**(int **)(s1 + 8) == 0x1a)) {
      s2 = *(tmbstr *)(s1 + 0x30);
      goto LAB_00164cc2;
    }
    s1 = *(tmbstr *)s1;
  } while( true );
}

Assistant:

static void MergeClasses(TidyDocImpl* doc, Node *node, Node *child)
{
    AttVal *av;
    tmbstr s1, s2, names;

    for (s2 = NULL, av = child->attributes; av; av = av->next)
    {
        if (attrIsCLASS(av))
        {
            s2 = av->value;
            break;
        }
    }

    for (s1 = NULL, av = node->attributes; av; av = av->next)
    {
        if (attrIsCLASS(av))
        {
            s1 = av->value;
            break;
        }
    }

    if (s1)
    {
        if (s2)  /* merge class names from both */
        {
            uint l1, l2;
            l1 = TY_(tmbstrlen)(s1);
            l2 = TY_(tmbstrlen)(s2);
            names = (tmbstr) TidyDocAlloc(doc, l1 + l2 + 2);
            TY_(tmbstrcpy)(names, s1);
            names[l1] = ' ';
            TY_(tmbstrcpy)(names+l1+1, s2);
            TidyDocFree(doc, av->value);
            av->value = names;
        }
    }
    else if (s2)  /* copy class names from child */
    {
        av = TY_(NewAttributeEx)( doc, "class", s2, '"' );
        TY_(InsertAttributeAtStart)( node, av );
    }
}